

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCBooter.cpp
# Opt level: O1

void __thiscall Storage::Disk::PCBooter::PCBooter(PCBooter *this,string *file_name)

{
  long lVar1;
  int iVar2;
  stat *psVar3;
  undefined4 *puVar4;
  int sectors_per_track;
  
  MFMSectorDump::MFMSectorDump(&this->super_MFMSectorDump,file_name);
  (this->super_MFMSectorDump).super_DiskImage._vptr_DiskImage =
       (_func_int **)&PTR__MFMSectorDump_005aa850;
  psVar3 = FileHolder::stats(&(this->super_MFMSectorDump).file_);
  lVar1 = psVar3->st_size;
  sectors_per_track = 8;
  if (lVar1 < 0x50000) {
    iVar2 = 1;
    if (lVar1 != 0x28000) {
      if (lVar1 != 0x2d000) {
LAB_0043d6bb:
        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar4 = 0xfffffffe;
        __cxa_throw(puVar4,&Error::typeinfo,0);
      }
      sectors_per_track = 9;
    }
  }
  else {
    sectors_per_track = 8;
    if (lVar1 != 0x50000) {
      if (lVar1 != 0x5a000) goto LAB_0043d6bb;
      sectors_per_track = 9;
    }
    iVar2 = 2;
  }
  this->head_count_ = iVar2;
  this->track_count_ = 0x28;
  this->sector_count_ = sectors_per_track;
  MFMSectorDump::set_geometry(&this->super_MFMSectorDump,sectors_per_track,'\x02','\x01',Double);
  return;
}

Assistant:

PCBooter::PCBooter(const std::string &file_name) :
	MFMSectorDump(file_name) {
	// The only sanity check here is whether a sensible
	// geometry is encoded in the first sector, or can be guessed.
	const auto file_size = file_.stats().st_size;

	// Check that file size is one of the accepted options.
	switch(file_size) {
		default: throw Error::InvalidFormat;

		case 512 * 8 * 40:
			head_count_ = 1;
			track_count_ = 40;
			sector_count_ = 8;
		break;

		case 512 * 8 * 40 * 2:
			head_count_ = 2;
			track_count_ = 40;
			sector_count_ = 8;
		break;

		case 512 * 9 * 40:
			head_count_ = 1;
			track_count_ = 40;
			sector_count_ = 9;
		break;

		case 512 * 9 * 40 * 2:
			head_count_ = 2;
			track_count_ = 40;
			sector_count_ = 9;
		break;
	}

	// TODO: probably single density, actually?
	set_geometry(sector_count_, 2, 1, Encodings::MFM::Density::Double);

	// TODO: check that an appropriate INT or similar is in the boot sector?
	// Should probably factor out the "does this look like a PC boot sector?" test,
	// as it can also be used to disambiguate FAT12 disks.
}